

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O3

FT_Error sdf_conic_to(FT_26D6_Vec *control_1,FT_26D6_Vec *to,void *user)

{
  long *plVar1;
  long lVar2;
  uint in_EAX;
  long *plVar3;
  FT_Error error;
  undefined8 uStack_28;
  
  if (to == (FT_26D6_Vec *)0x0 || control_1 == (FT_26D6_Vec *)0x0) {
    return 6;
  }
  plVar1 = *(long **)((long)user + 8);
  if (((*plVar1 == control_1->x) && (plVar1[1] == control_1->y)) ||
     ((control_1->x == to->x && (control_1->y == to->y)))) {
    sdf_line_to(to,user);
  }
  else {
    uStack_28 = (ulong)in_EAX;
    if (*user == (FT_Memory)0x0) {
      return 6;
    }
    plVar3 = (long *)ft_mem_qalloc(*user,0x50,(FT_Error *)((long)&uStack_28 + 4));
    if (uStack_28._4_4_ != 0) {
      return uStack_28._4_4_;
    }
    plVar3[8] = 0;
    plVar3[9] = 0;
    plVar3[6] = 0;
    plVar3[7] = 0;
    plVar3[4] = 0;
    plVar3[5] = 0;
    plVar3[2] = 0;
    plVar3[3] = 0;
    *plVar3 = 0;
    plVar3[1] = 0;
    *(undefined4 *)(plVar3 + 8) = 2;
    lVar2 = plVar1[1];
    *plVar3 = *plVar1;
    plVar3[1] = lVar2;
    lVar2 = control_1->y;
    plVar3[4] = control_1->x;
    plVar3[5] = lVar2;
    lVar2 = to->y;
    plVar3[2] = to->x;
    plVar3[3] = lVar2;
    plVar3[9] = plVar1[2];
    plVar1[2] = (long)plVar3;
    lVar2 = to->y;
    *plVar1 = to->x;
    plVar1[1] = lVar2;
  }
  return 0;
}

Assistant:

static FT_Error
  sdf_conic_to( const FT_26D6_Vec*  control_1,
                const FT_26D6_Vec*  to,
                void*               user )
  {
    SDF_Shape*    shape    = ( SDF_Shape* )user;
    SDF_Edge*     edge     = NULL;
    SDF_Contour*  contour  = NULL;

    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = shape->memory;


    if ( !control_1 || !to || !user )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    contour = shape->contours;

    /* If the control point coincides with any of the end points */
    /* then it is a line and should be treated as one to avoid   */
    /* unnecessary complexity later in the algorithm.            */
    if ( ( contour->last_pos.x == control_1->x &&
           contour->last_pos.y == control_1->y ) ||
         ( control_1->x == to->x &&
           control_1->y == to->y )               )
    {
      sdf_line_to( to, user );
      goto Exit;
    }

    FT_CALL( sdf_edge_new( memory, &edge ) );

    edge->edge_type = SDF_EDGE_CONIC;
    edge->start_pos = contour->last_pos;
    edge->control_a = *control_1;
    edge->end_pos   = *to;

    edge->next        = contour->edges;
    contour->edges    = edge;
    contour->last_pos = *to;

  Exit:
    return error;
  }